

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings
          (CThreadSynchronizationInfo *this)

{
  LIST_ENTRY *pLVar1;
  _LIST_ENTRY *p_Var2;
  _LIST_ENTRY *p_Var3;
  uint uVar4;
  PAL_ERROR PVar5;
  int iVar6;
  ulong uVar7;
  PAL_ERROR PVar8;
  PAL_ERROR PVar9;
  ulong uVar10;
  _LIST_ENTRY *pvMem;
  
  uVar4 = this->m_lPendingSignalingCount;
  if ((int)uVar4 < 0) {
    fprintf(_stderr,"] %s %s:%d","RunDeferredThreadConditionSignalings",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xfaa);
    fprintf(_stderr,"Expression: 0 <= m_lPendingSignalingCount\n");
    uVar4 = this->m_lPendingSignalingCount;
  }
  if ((int)uVar4 < 1) {
    PVar8 = 0;
  }
  else {
    uVar7 = 10;
    if (uVar4 < 10) {
      uVar7 = (ulong)uVar4;
    }
    uVar10 = 0;
    PVar9 = 0;
    PVar8 = 0;
    do {
      PVar5 = CPalSynchronizationManager::SignalThreadCondition
                        (&(this->m_rgpthrPendingSignalings[uVar10]->synchronizationInfo).
                          m_tnwdNativeData);
      if (PVar5 != 0) {
        PVar8 = PVar5;
        PVar9 = PVar5;
      }
      CPalThread::ReleaseThreadReference(this->m_rgpthrPendingSignalings[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
    iVar6 = this->m_lPendingSignalingCount;
    if (10 < iVar6) {
      pLVar1 = &this->m_lePendingSignalingsOverflowList;
      pvMem = (this->m_lePendingSignalingsOverflowList).Flink;
      if (pvMem != pLVar1) {
        do {
          p_Var2 = pvMem->Flink;
          p_Var3 = pvMem->Blink;
          p_Var3->Flink = p_Var2;
          p_Var2->Blink = p_Var3;
          PVar5 = CPalSynchronizationManager::SignalThreadCondition
                            ((ThreadNativeWaitData *)(pvMem[1].Flink + 0x1a));
          PVar8 = PVar9;
          if (PVar5 != 0) {
            PVar8 = PVar5;
          }
          CPalThread::ReleaseThreadReference((CPalThread *)pvMem[1].Flink);
          InternalFree(pvMem);
          uVar7 = (ulong)((int)uVar7 + 1);
          pvMem = pLVar1->Flink;
          PVar9 = PVar8;
        } while (pvMem != pLVar1);
        iVar6 = this->m_lPendingSignalingCount;
      }
      if ((int)uVar7 != iVar6) {
        fprintf(_stderr,"] %s %s:%d","RunDeferredThreadConditionSignalings",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xfe3);
        fprintf(_stderr,"Expression: lIdx == m_lPendingSignalingCount\n");
      }
    }
    this->m_lPendingSignalingCount = 0;
  }
  return PVar8;
}

Assistant:

PAL_ERROR CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings()
    {
        PAL_ERROR palErr = NO_ERROR;

        _ASSERTE(0 <= m_lPendingSignalingCount);

        if (0 < m_lPendingSignalingCount)
        {
            LONG lArrayPendingSignalingCount =
                min(PendingSignalingsArraySize, m_lPendingSignalingCount);
            LONG lIdx = 0;
            PAL_ERROR palTempErr;

            // Signal all the pending signalings from the array
            for (lIdx = 0; lIdx < lArrayPendingSignalingCount; lIdx++)
            {
                // Do the actual signaling
                palTempErr = CPalSynchronizationManager::SignalThreadCondition(
                    m_rgpthrPendingSignalings[lIdx]->synchronizationInfo.GetNativeData());
                if (NO_ERROR != palTempErr)
                {
                    palErr = palTempErr;
                }

                // Release the thread reference
                m_rgpthrPendingSignalings[lIdx]->ReleaseThreadReference();
            }

            // Signal any pending signalings from the array overflow list
            if (m_lPendingSignalingCount > PendingSignalingsArraySize)
            {
                PLIST_ENTRY pLink;
                DeferredSignalingListNode * pdsln;

                while (!IsListEmpty(&m_lePendingSignalingsOverflowList))
                {
                    // Remove a node from the head of the queue
                    // Note: no need to synchronize the access to this list since
                    // it is meant to be accessed only by the owner thread.
                    pLink = RemoveHeadList(&m_lePendingSignalingsOverflowList);
                    pdsln = CONTAINING_RECORD(pLink,
                                              DeferredSignalingListNode,
                                              Link);

                    // Do the actual signaling
                    palTempErr = CPalSynchronizationManager::SignalThreadCondition(
                        pdsln->pthrTarget->synchronizationInfo.GetNativeData());
                    if (NO_ERROR != palTempErr)
                    {
                        palErr = palTempErr;
                    }

                    // Release the thread reference
                    pdsln->pthrTarget->ReleaseThreadReference();

                    // Delete the node
                    InternalDelete(pdsln);

                    lIdx += 1;
                }

                _ASSERTE(lIdx == m_lPendingSignalingCount);
            }

            // Reset the counter of pending signalings for this thread
            m_lPendingSignalingCount = 0;
        }

        return palErr;
    }